

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-haproxy.c
# Opt level: O3

CURLcode Curl_cf_haproxy_insert_after(Curl_cfilter *cf_at,Curl_easy *data)

{
  CURLcode CVar1;
  undefined4 *ctx;
  Curl_cfilter *cf;
  Curl_cfilter *local_28;
  
  local_28 = (Curl_cfilter *)0x0;
  ctx = (undefined4 *)(*Curl_ccalloc)(1,0x28);
  if (ctx == (undefined4 *)0x0) {
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    *ctx = 0;
    Curl_dyn_init((dynbuf *)(ctx + 2),0x800);
    CVar1 = Curl_cf_create(&local_28,&Curl_cft_haproxy,ctx);
    if (CVar1 == CURLE_OK) {
      Curl_conn_cf_insert_after(cf_at,local_28);
      CVar1 = CURLE_OK;
    }
    else {
      Curl_dyn_free((dynbuf *)(ctx + 2));
      (*Curl_cfree)(ctx);
    }
  }
  return CVar1;
}

Assistant:

CURLcode Curl_cf_haproxy_insert_after(struct Curl_cfilter *cf_at,
                                      struct Curl_easy *data)
{
  struct Curl_cfilter *cf;
  CURLcode result;

  result = cf_haproxy_create(&cf, data);
  if(result)
    goto out;
  Curl_conn_cf_insert_after(cf_at, cf);

out:
  return result;
}